

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record-replay.cpp
# Opt level: O2

void replay_init_worker(__cilkrts_worker *w,global_state_t *g)

{
  ushort uVar1;
  replay_entry_t *prVar2;
  bool bVar3;
  int iVar4;
  record_replay_t rVar5;
  FILE *pFVar6;
  char *pcVar7;
  replay_entry_t *prVar8;
  undefined8 uVar9;
  int16_t *piVar10;
  uint uVar11;
  int32_t i2;
  int32_t i1;
  char ped_type [16];
  char worker_file_name [512];
  char local_238 [520];
  
  rVar5 = g->record_or_replay;
  if (rVar5 == RECORD_REPLAY_NONE) {
    return;
  }
  if (rVar5 == REPLAY_LOG) {
    i1 = -1;
    i2 = -1;
    snprintf_s_si(local_238,0x200,"%s%d.cilklog",w->g->record_replay_file_name,w->self);
    pFVar6 = fopen(local_238,"r");
    if (pFVar6 == (FILE *)0x0) {
      pcVar7 = "NULL != f";
      uVar9 = 0x233;
    }
    else {
      uVar11 = 1;
      while (iVar4 = feof(pFVar6), iVar4 == 0) {
        pcVar7 = fgets(worker_file_name,0x400,pFVar6);
        if (pcVar7 != (char *)0x0) {
          iVar4 = bcmp("Workers",worker_file_name,7);
          uVar11 = (uVar11 + 1) - (uint)(iVar4 == 0);
        }
      }
      prVar8 = (replay_entry_t *)__cilkrts_malloc((ulong)uVar11 * 0x10);
      w->l->replay_list_root = prVar8;
      prVar8[(ulong)uVar11 - 1].m_type = ped_type_last;
      rewind(pFVar6);
      prVar8 = w->l->replay_list_root;
      while ((iVar4 = feof(pFVar6), iVar4 == 0 &&
             (iVar4 = __isoc99_fscanf(pFVar6,"%s %s %d %d\n",ped_type,worker_file_name,&i1,&i2),
             iVar4 != -1))) {
        if (iVar4 != 4) {
          pcVar7 = "4 == fret";
          uVar9 = 0x242;
          goto LAB_0010a818;
        }
        if (ped_type._0_8_ == 0x7372656b726f57) {
          uVar11 = w->g->P;
          if (i1 != uVar11) {
            cilkos_error("Cannot continue replay: number of workers(%d) doesn\'t match that from the recording(%d).\n"
                         ,(ulong)uVar11,(ulong)(uint)i1);
          }
          if (i2 != 1) {
            cilkos_error("Pedigree file version %d doesn\'t match current version %d - cannot continue.\n"
                         ,(ulong)(uint)i2,1);
          }
        }
        else {
          replay_entry_t::load(prVar8,ped_type,worker_file_name,i1,i2);
          prVar8 = prVar8 + 1;
        }
      }
      if (prVar8->m_type == ped_type_last) {
        w->l->replay_list_entry = w->l->replay_list_root;
        fclose(pFVar6);
        prVar8 = w->l->replay_list_root;
        do {
          if (prVar8->m_type == ped_type_steal) {
            uVar1 = prVar8->m_value;
            if (((short)uVar1 < 0) || (g->total_workers <= (int)(short)uVar1)) {
              pcVar7 = "(entry->m_value >= 0) && (entry->m_value < g->total_workers)";
              uVar9 = 0x286;
              goto LAB_0010a818;
            }
            prVar2 = g->workers[uVar1]->l->replay_list_root;
            if (prVar2 == (replay_entry_t *)0x0) {
              pcVar7 = "NULL != victim_entry";
              uVar9 = 0x288;
              goto LAB_0010a818;
            }
            bVar3 = false;
            for (piVar10 = &prVar2->m_value;
                (!bVar3 && (*(ped_type_t *)(piVar10 + -3) != ped_type_last)); piVar10 = piVar10 + 8)
            {
              if ((*(ped_type_t *)(piVar10 + -3) == ped_type_orphaned) &&
                 ((prVar8->m_pedigree_len == piVar10[-1] &&
                  (iVar4 = bcmp(prVar8->m_reverse_pedigree,
                                ((replay_entry_t *)(piVar10 + -7))->m_reverse_pedigree,
                                (long)prVar8->m_pedigree_len << 3), iVar4 == 0)))) {
                *piVar10 = 0;
                bVar3 = true;
              }
              else {
                bVar3 = false;
              }
            }
          }
          else if (prVar8->m_type == ped_type_last) goto LAB_0010a755;
          prVar8 = prVar8 + 1;
        } while( true );
      }
      pcVar7 = "ped_type_last == entry->m_type";
      uVar9 = 0x26b;
    }
    goto LAB_0010a818;
  }
LAB_0010a75c:
  if (rVar5 == RECORD_LOG) {
    snprintf_s_si(worker_file_name,0x200,"%s%d.cilklog",g->record_replay_file_name,w->self);
    pFVar6 = fopen(worker_file_name,"w+");
    w->l->record_replay_fptr = (FILE *)pFVar6;
    if (pFVar6 == (FILE *)0x0) {
      pcVar7 = "NULL != w->l->record_replay_fptr";
      uVar9 = 0x2d2;
LAB_0010a818:
      __cilkrts_bug("%s:%d: cilk assertion failed: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/passlab[P]intel-cilk-runtime/runtime/record-replay.cpp"
                    ,uVar9,pcVar7);
    }
    if (w->self == 0) {
      write_to_replay_log(w,"Workers",(__cilkrts_pedigree *)0x0,g->P,1);
    }
  }
  return;
LAB_0010a755:
  rVar5 = g->record_or_replay;
  goto LAB_0010a75c;
}

Assistant:

void replay_init_worker(__cilkrts_worker* w, global_state_t *g)
{
    char worker_file_name[512];

    // If we're not recording or replaying a log, we're done.  All of the
    // fields in the global_state_t or local_state_t are already initialized
    // to default values.
    if (RECORD_REPLAY_NONE == g->record_or_replay)
        return;

    // If we're replaying a log, read worker's log and construct the
    // in-memory log
    if (REPLAY_LOG == g->record_or_replay)
    {
        // This function will also initialize and fill the worker's
        // replay list
        load_recorded_log(w);

        // Scan for orphans with no matching steal.  Mark them so they'll be
        // skipped as we advance through the log.
        scan_for_matching_steals(g, w->l->replay_list_root);

        // If we're recording the logs while replaying, create the log files.
        // This will only be used for debugging.  Create the logs in the
        // current directory.  It should be as good a place as any...
#if RECORD_ON_REPLAY
        cilk_snprintf_i(worker_file_name, sizeof(worker_file_name),
                        "replay_log_%d.cilklog",  w->self);
        w->l->record_replay_fptr = fopen(worker_file_name, "w+");
        CILK_ASSERT(NULL != w->l->record_replay_fptr);

        // Record the number of workers, file version in Worker 0's file
        if (w->self == 0) {
            write_to_replay_log (w, PED_TYPE_STR_WORKERS, NULL, g->P, PED_VERSION);
        }
#endif // RECORD_ON_REPLAY
    }

    // If we're recording, create the log files
    if (RECORD_LOG == g->record_or_replay)
    {
        cilk_snprintf_si(worker_file_name, sizeof(worker_file_name),
                         "%s%d.cilklog", g->record_replay_file_name, w->self);
        w->l->record_replay_fptr = fopen(worker_file_name, "w+");
        CILK_ASSERT(NULL != w->l->record_replay_fptr);

        // Record the number of workers, file version in Worker 0's file
        if (w->self == 0) {
            write_to_replay_log(w, PED_TYPE_STR_WORKERS, NULL, g->P, PED_VERSION);
        }
    }
}